

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_common.c
# Opt level: O3

void sylvan_gc_normal_resize_WRAP(WorkerP *w,Task *__dq_head,TD_sylvan_gc_normal_resize *t)

{
  ulong uVar1;
  llmsset_t plVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 auStack_58 [64];
  
  uVar5 = nodes->max_size;
  uVar1 = nodes->table_size;
  if (uVar1 < uVar5) {
    auStack_58._0_8_ = llmsset_count_marked_WRAP;
    auStack_58._8_8_ = (__pointer_type)0x1;
    auStack_58._16_8_ = nodes;
    lace_run_task((Task *)auStack_58);
    plVar2 = nodes;
    if (uVar1 < (ulong)(auStack_58._16_8_ * 2)) {
      uVar6 = uVar1 * 2;
      if (uVar5 <= uVar1 * 2) {
        uVar6 = uVar5;
      }
      if ((0x80 < uVar6) && (uVar6 <= nodes->max_size)) {
        nodes->table_size = uVar6;
        plVar2->mask = uVar6 - 1;
        LOCK();
        plVar2->threshold = (short)LZCOUNT(uVar6) * -2 + 0xc0;
        UNLOCK();
      }
      sVar3 = cache_getsize();
      sVar4 = cache_getmaxsize();
      if (sVar3 < sVar4) {
        uVar5 = sVar3 * 2;
        if (sVar4 <= sVar3 * 2) {
          uVar5 = sVar4;
        }
        cache_setsize(uVar5);
      }
    }
  }
  return;
}

Assistant:

VOID_TASK_IMPL_0(sylvan_gc_normal_resize)
{
    size_t nodes_size = llmsset_get_size(nodes);
    size_t nodes_max = llmsset_get_max_size(nodes);
    if (nodes_size < nodes_max) {
        size_t marked = llmsset_count_marked(nodes);
        if (marked*2 > nodes_size) {
            size_t new_size = next_size(nodes_size);
            if (new_size > nodes_max) new_size = nodes_max;
            llmsset_set_size(nodes, new_size);

            // also increase the operation cache
            size_t cache_size = cache_getsize();
            size_t cache_max = cache_getmaxsize();
            if (cache_size < cache_max) {
                new_size = next_size(cache_size);
                if (new_size > cache_max) new_size = cache_max;
                cache_setsize(new_size);
            }
        }
    }
}